

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O3

JL_STATUS JlMemoryVerifyCountFieldLargeEnoughForValue(size_t CountFieldSize,size_t Value)

{
  JL_STATUS JVar1;
  bool bVar2;
  
  switch(CountFieldSize) {
  case 1:
    bVar2 = Value < 0x100;
    break;
  case 2:
    bVar2 = Value < 0x10000;
    break;
  default:
    return JL_STATUS_INTERNAL_ERROR;
  case 4:
    JVar1 = JL_STATUS_COUNT_FIELD_TOO_SMALL;
    if (Value >> 0x20 == 0) {
      JVar1 = JL_STATUS_SUCCESS;
    }
    return JVar1;
  case 8:
    return JL_STATUS_SUCCESS;
  }
  JVar1 = JL_STATUS_COUNT_FIELD_TOO_SMALL;
  if (bVar2) {
    JVar1 = JL_STATUS_SUCCESS;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlMemoryVerifyCountFieldLargeEnoughForValue
    (
        size_t          CountFieldSize,
        size_t          Value
    )
{
    JL_STATUS jlStatus;

    jlStatus = JL_STATUS_COUNT_FIELD_TOO_SMALL;
    if( sizeof(uint8_t) == CountFieldSize )
    {
        if( Value <= 0xff )
        {
            jlStatus = JL_STATUS_SUCCESS;
        }
    }
    else if( sizeof(uint16_t) == CountFieldSize )
    {
        if( Value <= 0xffff )
        {
            jlStatus = JL_STATUS_SUCCESS;
        }
    }
    else if( sizeof(uint32_t) == CountFieldSize )
    {
        if( Value <= 0xffffffff )
        {
            jlStatus = JL_STATUS_SUCCESS;
        }
    }
    else if( sizeof(uint64_t) == CountFieldSize )
    {
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        jlStatus = JL_STATUS_INTERNAL_ERROR;
    }

    return jlStatus;
}